

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_verify_s256_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,word256 mask_a,
               word256 mask_b,word256 mask_c)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  word256 x0s [2];
  word256 x2m [2];
  word256 r1m [2];
  word256 r0m [2];
  word256 r1s [2];
  word256 r0s [2];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar1 = 0;
  do {
    auVar2 = *(undefined1 (*) [32])((long)in->w64 + lVar1);
    auVar5 = vpand_avx2(auVar2,in_ZMM0._0_32_);
    auVar6 = vpsllq_avx2(auVar5,2);
    auVar5 = vpsrlq_avx2(auVar5,0x3e);
    auVar5 = vpermq_avx2(auVar5,0x93);
    auVar5 = vpor_avx2(auVar5,auVar6);
    *(undefined1 (*) [32])(local_1c0 + lVar1) = auVar5;
    auVar6 = vpand_avx2(auVar2,in_ZMM1._0_32_);
    auVar5 = vpaddq_avx2(auVar6,auVar6);
    auVar6 = vpsrlq_avx2(auVar6,0x3f);
    auVar6 = vpermq_avx2(auVar6,0x93);
    auVar5 = vpor_avx2(auVar6,auVar5);
    *(undefined1 (*) [32])(local_200 + lVar1) = auVar5;
    auVar4 = in_ZMM2._0_32_;
    auVar2 = vpand_avx2(auVar2,auVar4);
    *(undefined1 (*) [32])(local_180 + lVar1) = auVar2;
    auVar2 = *(undefined1 (*) [32])((long)rvec + lVar1);
    auVar5 = vpand_avx2(auVar2,in_ZMM0._0_32_);
    auVar6 = vpsllq_avx2(auVar5,2);
    auVar5 = vpsrlq_avx2(auVar5,0x3e);
    auVar5 = vpermq_avx2(auVar5,0x93);
    auVar5 = vpor_avx2(auVar5,auVar6);
    *(undefined1 (*) [32])(local_80 + lVar1) = auVar5;
    auVar6 = vpand_avx2(auVar2,in_ZMM1._0_32_);
    auVar5 = vpaddq_avx2(auVar6,auVar6);
    auVar6 = vpsrlq_avx2(auVar6,0x3f);
    auVar6 = vpermq_avx2(auVar6,0x93);
    auVar5 = vpor_avx2(auVar6,auVar5);
    *(undefined1 (*) [32])(local_c0 + lVar1) = auVar5;
    auVar2 = vpand_avx2(auVar2,auVar4);
    *(undefined1 (*) [32])(local_240 + lVar1) = auVar2;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 == 0x20);
  auVar2 = vpternlogq_avx512vl(local_220 ^ local_240,local_1c0 ^ local_1a0,local_200,0x78);
  local_100 = vpternlogq_avx512vl(auVar2,local_1e0,local_1c0,0x78);
  *(undefined1 (*) [32])view->s[0].w64 = local_100;
  auVar2 = *(undefined1 (*) [32])view->s[1].w64;
  local_e0 = vpand_avx2(auVar2,auVar4);
  auVar5 = vpternlogq_avx512vl(local_1e0,local_180,local_200,0x48);
  auVar5 = vpternlogq_avx512vl(local_a0,auVar5,local_c0,0x96);
  local_240 = vpternlogq_avx512vl(auVar5,local_160,local_200,0x78);
  auVar6 = vpsrlq_avx2(local_240,1);
  auVar5 = vpsllq_avx2(local_240,0x3f);
  auVar5 = vpermq_avx2(auVar5,0x39);
  auVar3 = vpternlogq_avx512vl(auVar5,local_100,auVar6,0x36);
  *(undefined1 (*) [32])view->s[0].w64 = auVar3;
  auVar5 = vpaddq_avx2(auVar2,auVar2);
  auVar6 = vpsrlq_avx2(auVar2,0x3f);
  auVar6 = vpermq_avx2(auVar6,0x93);
  local_220 = vpternlogq_avx512vl(auVar6,auVar4,auVar5,200);
  auVar5 = vpand_avx2(local_160,local_1c0);
  auVar5 = vpternlogq_avx512vl(auVar5,local_180,local_1c0 ^ local_1a0,0x78);
  local_140 = vpternlogq_avx512vl(auVar5,local_60,local_80,0x96);
  auVar6 = vpsrlq_avx2(local_140,2);
  auVar5 = vpsllq_avx2(local_140,0x3e);
  auVar5 = vpermq_avx2(auVar5,0x39);
  auVar5 = vpternlogq_avx512vl(auVar5,auVar3,auVar6,0x36);
  *(undefined1 (*) [32])view->s[0].w64 = auVar5;
  auVar5 = vpsllq_avx2(auVar2,2);
  auVar2 = vpsrlq_avx2(auVar2,0x3e);
  auVar2 = vpermq_avx2(auVar2,0x93);
  local_120 = vpternlogq_avx512vl(auVar2,auVar4,auVar5,200);
  lVar1 = 0;
  do {
    auVar2 = *(undefined1 (*) [32])(local_1c0 + lVar1) ^ *(undefined1 (*) [32])(local_240 + lVar1);
    *(undefined1 (*) [32])(local_240 + lVar1) = auVar2;
    auVar6 = *(undefined1 (*) [32])(local_1c0 + lVar1) ^ *(undefined1 (*) [32])(local_200 + lVar1);
    auVar5 = auVar6 ^ *(undefined1 (*) [32])(local_140 + lVar1);
    *(undefined1 (*) [32])(local_140 + lVar1) = auVar5;
    auVar6 = auVar6 ^ *(undefined1 (*) [32])(local_100 + lVar1);
    *(undefined1 (*) [32])(local_100 + lVar1) = auVar6;
    auVar4 = vpsrlq_avx2(auVar2,2);
    auVar2 = vpsllq_avx2(auVar2,0x3e);
    auVar2 = vpermq_avx2(auVar2,0x39);
    auVar2 = vpor_avx2(auVar2,auVar4);
    *(undefined1 (*) [32])(local_1c0 + lVar1) = auVar2;
    auVar4 = vpsrlq_avx2(auVar5,1);
    auVar5 = vpsllq_avx2(auVar5,0x3f);
    auVar5 = vpermq_avx2(auVar5,0x39);
    auVar5 = vpor_avx2(auVar5,auVar4);
    *(undefined1 (*) [32])(local_200 + lVar1) = auVar5;
    auVar2 = vpternlogq_avx512vl(auVar2 ^ *(undefined1 (*) [32])(local_180 + lVar1),auVar5,auVar6,
                                 0x96);
    *(undefined1 (*) [32])((long)out->w64 + lVar1) = auVar2;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 == 0x20);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void mpc_sbox_verify_s256_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                     const rvec_t* rvec, const word256 mask_a, const word256 mask_b,
                                     const word256 mask_c) {
  bitsliced_mm256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm256_and_verify_def(r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm256_and_verify_def(r2m, x1s, x2m, r1s, mask_c, 1);
  // c & a
  mpc_mm256_and_verify_def(r1m, x0s, x2m, r0s, mask_c, 2);

  bitsliced_mm256_step_2(SC_VERIFY);
}